

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int twacf(double *P,int MP,double *Q,int MQ,double *ACF,int MA,double *CVLI,int MXPQ1,double *ALPHA,
         int MXPQ)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double *local_58;
  
  iVar1 = imax(MP,MQ);
  uVar2 = 2;
  if (iVar1 == MXPQ) {
    uVar2 = (uint)(MQ | MP) >> 0x1f;
  }
  uVar5 = 3;
  if (MXPQ + 1 == MXPQ1) {
    uVar5 = uVar2;
  }
  uVar2 = 4;
  if (MXPQ1 <= MA) {
    uVar2 = uVar5;
  }
  if (uVar2 == 0) {
    *ACF = 1.0;
    *CVLI = 1.0;
    uVar2 = 0;
    if (MA != 1) {
      for (lVar6 = 1; lVar6 < MA; lVar6 = lVar6 + 1) {
        ACF[lVar6] = 0.0;
      }
      if (MXPQ1 != 1) {
        for (lVar6 = 1; lVar6 < MXPQ1; lVar6 = lVar6 + 1) {
          CVLI[lVar6] = 0.0;
        }
        uVar3 = 0;
        uVar13 = 0;
        if (0 < MXPQ) {
          uVar13 = (ulong)(uint)MXPQ;
        }
        for (; uVar13 != uVar3; uVar3 = uVar3 + 1) {
          ALPHA[uVar3] = 0.0;
        }
        if (MQ != 0) {
          iVar1 = 0;
          if (0 < MQ) {
            iVar1 = MQ;
          }
          pdVar8 = Q;
          for (uVar3 = 1; uVar3 != iVar1 + 1; uVar3 = uVar3 + 1) {
            CVLI[uVar3] = -Q[uVar3 - 1];
            dVar15 = -Q[uVar3 - 1];
            ACF[uVar3] = dVar15;
            if (uVar3 != (uint)MQ) {
              for (uVar11 = 1; (long)uVar11 <= (long)((long)MQ - uVar3); uVar11 = uVar11 + 1) {
                dVar15 = dVar15 + Q[uVar11 - 1] * pdVar8[uVar11];
                ACF[uVar3] = dVar15;
              }
            }
            *ACF = Q[uVar3 - 1] * Q[uVar3 - 1] + *ACF;
            pdVar8 = pdVar8 + 1;
          }
        }
        if (MP != 0) {
          uVar3 = 0;
          uVar11 = 0;
          if (0 < MP) {
            uVar11 = (ulong)(uint)MP;
          }
          for (; uVar11 != uVar3; uVar3 = uVar3 + 1) {
            dVar15 = P[uVar3];
            ALPHA[uVar3] = dVar15;
            CVLI[uVar3] = dVar15;
          }
          lVar10 = (long)MXPQ;
          lVar12 = (long)MP;
          uVar13 = (ulong)((int)uVar13 + 1);
          lVar6 = lVar10 + -2;
          local_58 = ALPHA + lVar10;
          uVar3 = 1;
          while( true ) {
            local_58 = local_58 + -1;
            lVar7 = 1;
            if (uVar3 == uVar13) break;
            lVar14 = lVar10 - uVar3;
            if (lVar14 < lVar12) {
              dVar15 = 1.0 - ALPHA[lVar14] * ALPHA[lVar14];
              if (dVar15 <= 1e-10) {
                return 5;
              }
              lVar4 = lVar6;
              if (uVar3 == (uint)MXPQ) break;
              for (; lVar7 <= lVar14; lVar7 = lVar7 + 1) {
                ALPHA[lVar7 + -1] = (ALPHA[lVar14] * CVLI[lVar4] + CVLI[lVar7 + -1]) / dVar15;
                lVar4 = lVar4 + -1;
              }
            }
            if (lVar14 < MQ) {
              iVar1 = imax(((int)lVar14 - MP) + 1,1);
              lVar7 = (long)iVar1;
              pdVar8 = local_58 + -lVar7;
              for (; lVar7 <= lVar14; lVar7 = lVar7 + 1) {
                ACF[lVar7] = ACF[lVar14 + 1] * *pdVar8 + ACF[lVar7];
                pdVar8 = pdVar8 + -1;
              }
            }
            lVar7 = 1;
            if (lVar14 < lVar12) {
              for (; lVar7 <= lVar14; lVar7 = lVar7 + 1) {
                CVLI[lVar7 + -1] = ALPHA[lVar7 + -1];
              }
            }
            uVar3 = uVar3 + 1;
            lVar6 = lVar6 + -1;
          }
          *ACF = *ACF * 0.5;
          lVar6 = 0x10;
          lVar10 = 0x100000000;
          for (uVar3 = 1; uVar3 != uVar13; uVar3 = uVar3 + 1) {
            if ((long)uVar3 <= lVar12) {
              dVar15 = ALPHA[uVar3 - 1];
              lVar7 = lVar10;
              for (lVar14 = 0; lVar6 != lVar14; lVar14 = lVar14 + 8) {
                *(double *)((long)CVLI + lVar14) =
                     (ALPHA[uVar3 - 1] * *(double *)((long)ACF + (lVar7 >> 0x1d)) +
                     *(double *)((long)ACF + lVar14)) / (1.0 - dVar15 * dVar15);
                lVar7 = lVar7 + -0x100000000;
              }
              for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 8) {
                *(undefined8 *)((long)ACF + lVar7) = *(undefined8 *)((long)CVLI + lVar7);
              }
            }
            lVar10 = lVar10 + 0x100000000;
            lVar6 = lVar6 + 8;
          }
          if (MA < 1) {
            MA = 0;
          }
          for (uVar3 = 1; uVar3 != MA + 1; uVar3 = uVar3 + 1) {
            uVar2 = imin((int)uVar3 + -1,MP);
            if (uVar2 != 0) {
              uVar13 = (ulong)uVar2;
              if ((int)uVar2 < 1) {
                uVar13 = 0;
              }
              lVar6 = -0x200000000;
              for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
                ACF[uVar3 - 1] =
                     P[uVar11] * *(double *)((long)ACF + (lVar6 >> 0x1d) + uVar3 * 8) +
                     ACF[uVar3 - 1];
                lVar6 = lVar6 + -0x100000000;
              }
            }
          }
          *ACF = *ACF + *ACF;
          *CVLI = 1.0;
          if (0 < MQ) {
            pdVar8 = CVLI;
            for (uVar3 = 1; uVar3 != MQ + 1; uVar3 = uVar3 + 1) {
              CVLI[uVar3] = -Q[uVar3 - 1];
              uVar2 = imin((int)uVar3,MP);
              uVar13 = (ulong)uVar2;
              if ((int)uVar2 < 1) {
                uVar13 = 0;
              }
              pdVar9 = P;
              for (lVar6 = 0; -lVar6 != uVar13; lVar6 = lVar6 + -1) {
                CVLI[uVar3] = *pdVar9 * pdVar8[lVar6] + CVLI[uVar3];
                pdVar9 = pdVar9 + 1;
              }
              pdVar8 = pdVar8 + 1;
            }
            return 0;
          }
        }
        uVar2 = 0;
      }
    }
  }
  return uVar2;
}

Assistant:

int twacf(double *P, int MP, double *Q, int MQ, double *ACF, int MA, double *CVLI, int MXPQ1, double *ALPHA, int MXPQ) {
	int ifault, i, k, kc, j, jpk, kcp1mj, j1, kp1, kp2mj, miim1p, imj, mikp, kp1mj;
	double epsil2, zero, one, half, two, div;

	ifault = 0;
	epsil2 = 1.0e-10;
	zero = 0.0; half = 0.5, one = 1.0, two = 2.0;

	if (MP < 0 || MQ < 0) {
		ifault = 1;
	}
	if (MXPQ != imax(MP, MQ)) {
		ifault = 2;
	}
	if (MXPQ1 != MXPQ + 1) {
		ifault = 3;
	}
	if (MA < MXPQ1) {
		ifault = 4;
	}

	if (ifault > 0) {
		return ifault;
	}

	// Initialization and return if MP = MQ = 0

	ACF[0] = one;
	CVLI[0] = one;

	if (MA == 1) {
		return ifault;
	}

	for (i = 1; i < MA; ++i) {
		ACF[i] = zero;
	}

	if (MXPQ1 == 1) {
		return ifault;
	}

	for (i = 1; i < MXPQ1; ++i) {
		CVLI[i] = zero;
	}
	for (k = 0; k < MXPQ; ++k) {
		ALPHA[k] = 0.0;
	}

	// Computation of the A.C.F. of the moving average part stored in ACF

	if (MQ != 0) {
		for (k = 1; k <= MQ; ++k) {
			CVLI[k] = -Q[k - 1];
			ACF[k] = -Q[k - 1];
			kc = MQ - k;
			if (kc != 0) {
				for (j = 1; j <= kc; ++j) {
					jpk = j + k;
					ACF[k] += (Q[j - 1] * Q[jpk - 1]);
				}
			}//120
			ACF[0] += (Q[k - 1] * Q[k - 1]);
		}

		//Initialization of CVLI = T.W.-S.PHI -- return if MP = 0
	}//180

	if (MP == 0) {
		return ifault;
	}

	for (k = 0; k < MP; ++k) {
		ALPHA[k] = P[k];
		CVLI[k] = P[k];
	}

	// Computation of T.W.-S ALPHA and DELTA
	// DELTA stored in ACF which is gradually overwritten

	for (k = 1; k <= MXPQ; ++k) {
		kc = MXPQ - k;
		if (kc < MP) {
			div = one - ALPHA[kc] * ALPHA[kc];
			if (div <= epsil2) {
				return 5;
			}
			if (kc == 0) {
				break; //break For loop. Go to 290
			}//290
			for (j = 1; j <= kc; ++j) {
				kcp1mj = kc - j;
				ALPHA[j - 1] = (CVLI[j - 1] + ALPHA[kc] * CVLI[kcp1mj]) / div;
			}
		}//240
		if (kc < MQ) {
			j1 = imax(kc + 1 - MP, 1);
			for (j = j1; j <= kc; ++j) {
				kcp1mj = kc - j;
				ACF[j] += ACF[kc + 1] * ALPHA[kcp1mj];
			}
		}//260
		if (kc < MP) {
			for (j = 1; j <= kc; ++j) {
				CVLI[j - 1] = ALPHA[j - 1];
			}
		}
	}//290

	// Computation of T.W.-S NU
	// NU is stored in CVLI copied into ACF

	ACF[0] *= half;
	for (k = 1; k <= MXPQ; ++k) {
		if (k <= MP) {
			kp1 = k + 1;
			div = one - ALPHA[k - 1] * ALPHA[k - 1];
			for (j = 1; j <= kp1; ++j) {
				kp2mj = k + 2 - j;
				CVLI[j - 1] = (ACF[j - 1] + ALPHA[k - 1] * ACF[kp2mj - 1]) / div;
			}
			for (j = 1; j <= kp1; ++j) {
				ACF[j - 1] = CVLI[j - 1];
			}
		}//330
	}//330

	//Computation of ACF

	for (i = 1; i <= MA; ++i) {
		miim1p = imin(i - 1, MP);
		if (miim1p != 0) {
			for (j = 1; j <= miim1p; ++j) {
				imj = i - j; 
				ACF[i - 1] += P[j - 1] * ACF[imj - 1];
			}
		}//430
	}//430

	ACF[0] *= two;

	//Computation of CVLI

	CVLI[0] = one;
	if (MQ > 0) {
		for (k = 1; k <= MQ; ++k) {
			CVLI[k] = -Q[k - 1];
			if (MP != 0) {
				mikp = imin(k, MP);
				for (j = 1; j <= mikp; ++j) {
					kp1mj = k + 1 - j;
					CVLI[k] += P[j - 1] * CVLI[kp1mj - 1];
				}
			}
		}
	}

	return ifault;
}